

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O3

t_macro * macro_look(int *ip)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  t_macro *ptVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  char name [32];
  byte local_58 [40];
  
  iVar2 = *ip;
  uVar6 = 0;
  lVar5 = 0;
  while( true ) {
    bVar1 = prlnbuf[lVar5 + iVar2];
    if (((ulong)bVar1 < 0x3c) && ((0x800000100000201U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      local_58[lVar5] = 0;
      ptVar4 = (t_macro *)(macro_tbl + (uVar6 & 0xff));
      do {
        ptVar4 = ptVar4->next;
        if (ptVar4 == (t_macro *)0x0) {
          return (t_macro *)0x0;
        }
        iVar2 = strcmp((char *)local_58,ptVar4->name);
      } while (iVar2 != 0);
      return ptVar4;
    }
    ppuVar3 = __ctype_b_loc();
    if (((((*ppuVar3)[(char)bVar1] & 8) == 0) && (bVar1 != 0x5f)) && (bVar1 != 0x2e)) break;
    if (lVar5 == 0x1f) {
      return (t_macro *)0x0;
    }
    if ((lVar5 == 0 & (byte)((*ppuVar3)[(char)bVar1] >> 0xb) & 1) != 0) {
      return (t_macro *)0x0;
    }
    local_58[lVar5] = bVar1;
    iVar7 = uVar6 + (int)(char)bVar1;
    uVar6 = (iVar7 >> 5) + (int)(char)bVar1 + iVar7 * 8;
    *ip = (int)lVar5 + iVar2 + 1;
    lVar5 = lVar5 + 1;
  }
  return (t_macro *)0x0;
}

Assistant:

struct t_macro *macro_look(int *ip)
{
	struct t_macro *ptr;
	char name[32];
	char c;
	int  hash;
	int  l;

	/* calculate the symbol hash value and check syntax */
	l = 0;
	hash = 0;
	for (;;) {
		c = prlnbuf[*ip];
		if (c == '\0' || c == ' ' || c == '\t' || c == ';')
			break;

		if (!isalnum(c) && c != '_')
		{ if(c!=0x2e) {	return (NULL); }}
		if (l == 0) {
			if (isdigit(c))
				return (NULL);
		}
		if (l == 31)
			return (NULL);
		name[l++] = c;
		hash += c;
		hash  = (hash << 3) + (hash >> 5) + c;
		(*ip)++;
	}
	name[l] = '\0';
	hash &= 0xFF;

	/* browse the hash table */
	ptr = macro_tbl[hash];
	while (ptr) {
		if (!strcmp(name, ptr->name))
			break;
		ptr = ptr->next;
	}

	/* return result */
	return (ptr);
}